

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::RangeSelectExpression::getLongestStaticPrefixesImpl
          (RangeSelectExpression *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,EvalContext *evalContext,Expression *longestStaticPrefix)

{
  RangeSelectExpression *in_RDI;
  EvalContext *in_stack_00000070;
  RangeSelectExpression *in_stack_00000078;
  EvalContext *in_stack_00000080;
  SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
  *in_stack_00000088;
  Expression *in_stack_00000090;
  
  isConstantSelect(in_stack_00000078,in_stack_00000070);
  value(in_RDI);
  Expression::getLongestStaticPrefixes
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,
             &in_stack_00000078->super_Expression);
  return;
}

Assistant:

void RangeSelectExpression::getLongestStaticPrefixesImpl(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    EvalContext& evalContext, const Expression* longestStaticPrefix) const {

    if (isConstantSelect(evalContext)) {
        if (!longestStaticPrefix)
            longestStaticPrefix = this;
    }
    else {
        longestStaticPrefix = nullptr;
    }

    value().getLongestStaticPrefixes(results, evalContext, longestStaticPrefix);
}